

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::CNegativeNoVAOArrays<glcts::(anonymous_namespace)::test_api::ES3>::Cleanup
          (CNegativeNoVAOArrays<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  
  uVar1 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[2])();
  if ((uVar1 & 0x300) == 0) {
    glu::CallLogWrapper::glDisableVertexAttribArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
  }
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->_program);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->_bufferIndirect);
  return 0;
}

Assistant:

virtual long Cleanup()
	{

		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
			glDisableVertexAttribArray(0);

		glUseProgram(0);
		glDeleteProgram(_program);
		glDeleteBuffers(1, &_buffer);
		glDeleteBuffers(1, &_bufferIndirect);
		return NO_ERROR;
	}